

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O0

uint32_t __thiscall
ans_sint_decode::decode_sym<dec_entry_sint>(ans_sint_decode *this,uint64_t *state,uint8_t **in_u8)

{
  uchar *puVar1;
  uint *puVar2;
  long *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  uint32_t *in_ptr_u32;
  dec_entry_sint *entry;
  dec_entry_sint *tbl;
  
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x18c1a5);
  puVar2 = (uint *)(puVar1 + (*in_RSI & *(ulong *)(in_RDI + 0x20)) * 0xc);
  *in_RSI = (ulong)*puVar2 * (*in_RSI >> ((byte)*(undefined8 *)(in_RDI + 0x28) & 0x3f)) +
            (ulong)puVar2[1];
  if (*in_RSI < *(ulong *)(in_RDI + 0x30)) {
    *in_RDX = *in_RDX + -4;
    *in_RSI = *in_RSI << 0x20 | (ulong)*(uint *)*in_RDX;
  }
  return puVar2[2];
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        auto tbl = reinterpret_cast<const t_entry*>(table.data());
        const auto& entry = tbl[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        return entry.sym;
    }